

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall session::on_readable(session *this)

{
  buffer *this_00;
  socket_t fd;
  int iVar1;
  char *data;
  
  this_00 = &this->recvbuf_;
  while( true ) {
    if (this->closed_ != false) {
      return;
    }
    fd = this->fd_;
    data = buffer::tail(this_00);
    iVar1 = buffer::space(this_00);
    iVar1 = recv_data(fd,data,iVar1);
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_001086e0;
    }
    buffer::pop_space(this_00,iVar1);
    dispatch(this);
  }
  iVar1 = get_network_err();
  if (iVar1 == 0) {
    return;
  }
LAB_001086e0:
  on_error(this,iVar1);
  return;
}

Assistant:

void session::on_readable()
{
    while (!closed_)
    {
        int recv_len = recv_data(fd_, recvbuf_.tail(), recvbuf_.space());
        if (recv_len < 0)
        {
            int error = get_network_err();
            if (error != 0)
            {
                on_error(error);
                return;
            }
            break;
        }
        
        if (recv_len == 0)
        {
            on_error(0);
            return;
        }

        recvbuf_.pop_space(recv_len);
        this->dispatch();
    }
}